

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateSetDictionary(zng_stream *strm,uint8_t *dictionary,uint32_t dictLength)

{
  deflate_state *pdVar1;
  uint8_t *puVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint in_EDX;
  uint8_t *in_RSI;
  zng_stream *in_RDI;
  uchar *next;
  uint32_t avail;
  int wrap;
  uint n;
  uint str;
  deflate_state *s;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32_t uVar6;
  uint local_1c;
  uint8_t *local_18;
  int32_t local_4;
  
  iVar3 = deflateStateCheck(in_RDI);
  if ((iVar3 == 0) && (in_RSI != (uint8_t *)0x0)) {
    pdVar1 = in_RDI->state;
    iVar3 = pdVar1->wrap;
    if ((iVar3 == 2) || (((iVar3 == 1 && (pdVar1->status != 1)) || (pdVar1->lookahead != 0)))) {
      local_4 = -2;
    }
    else {
      if (iVar3 == 1) {
        uVar4 = (*functable.adler32)(in_RDI->adler,in_RSI,(size_t)in_EDX);
        in_RDI->adler = uVar4;
      }
      pdVar1->wrap = 0;
      local_1c = in_EDX;
      local_18 = in_RSI;
      if (pdVar1->w_size <= in_EDX) {
        if (iVar3 == 0) {
          memset(pdVar1->head,0,0x20000);
          pdVar1->strstart = 0;
          pdVar1->block_start = 0;
          pdVar1->insert = 0;
        }
        local_18 = in_RSI + (in_EDX - pdVar1->w_size);
        local_1c = pdVar1->w_size;
      }
      uVar4 = in_RDI->avail_in;
      puVar2 = in_RDI->next_in;
      in_RDI->avail_in = local_1c;
      in_RDI->next_in = local_18;
      zng_fill_window((deflate_state *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                     );
      while (2 < pdVar1->lookahead) {
        uVar6 = pdVar1->strstart;
        uVar5 = pdVar1->lookahead - 2;
        (*pdVar1->insert_string)(pdVar1,uVar6,uVar5);
        pdVar1->strstart = uVar6 + uVar5;
        pdVar1->lookahead = 2;
        zng_fill_window((deflate_state *)CONCAT44(uVar6,uVar5));
      }
      pdVar1->strstart = pdVar1->lookahead + pdVar1->strstart;
      pdVar1->block_start = pdVar1->strstart;
      pdVar1->insert = pdVar1->lookahead;
      pdVar1->lookahead = 0;
      pdVar1->prev_length = 0;
      pdVar1->match_available = 0;
      in_RDI->next_in = puVar2;
      in_RDI->avail_in = uVar4;
      pdVar1->wrap = iVar3;
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateSetDictionary)(PREFIX3(stream) *strm, const uint8_t *dictionary, uint32_t dictLength) {
    deflate_state *s;
    unsigned int str, n;
    int wrap;
    uint32_t avail;
    const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = FUNCTABLE_CALL(adler32)(strm->adler, dictionary, dictLength);
    DEFLATE_SET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const unsigned char *)dictionary;
    PREFIX(fill_window)(s);
    while (s->lookahead >= STD_MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (STD_MIN_MATCH - 1);
        s->insert_string(s, str, n);
        s->strstart = str + n;
        s->lookahead = STD_MIN_MATCH - 1;
        PREFIX(fill_window)(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (int)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->prev_length = 0;
    s->match_available = 0;
    strm->next_in = (z_const unsigned char *)next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}